

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcode.cpp
# Opt level: O2

void selfCheckMapcodeToLatLon(char *mapcode,double lat,double lon)

{
  MapcodeError MVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double foundLon;
  double foundLat;
  
  MVar1 = decodeMapcodeToLatLonUtf8
                    (&foundLat,&foundLon,mapcode,TERRITORY_NONE,(MapcodeElements *)0x0);
  if (MVar1 == ERR_OK) {
    dVar3 = foundLat - lat;
    uVar2 = -(ulong)(dVar3 < -dVar3);
    dVar4 = foundLon - lon;
    if (dVar4 <= -dVar4) {
      dVar4 = -dVar4;
    }
    if (((double)(~uVar2 & (ulong)dVar3 | (ulong)-dVar3 & uVar2) <= 0.001) &&
       ((double)(~-(ulong)(180.0 < dVar4) & (ulong)dVar4 |
                (ulong)(360.0 - dVar4) & -(ulong)(180.0 < dVar4)) <= 0.001)) {
      return;
    }
    fprintf(_stderr,
            "error: decoding mapcode to lat/lon failure; lat=%.20g, lon=%.20g produces mapcode %s, which decodes to lat=%.20g (delta=%.20g), lon=%.20g (delta=%.20g)\n"
            ,lat,lon,mapcode);
  }
  else {
    fprintf(_stderr,"error: decoding mapcode to lat/lon failure; cannot decode \'%s\')\n",mapcode);
  }
  if (selfCheckEnabled == 0) {
    return;
  }
  exit(2);
}

Assistant:

static void selfCheckMapcodeToLatLon(const char *mapcode,
                                     const double lat, const double lon) {
    double foundLat;
    double foundLon;
    // TODO: Fix self-check.
    // int foundContext = getTerritoryCode(territory, TERRITORY_NONE);
    enum Territory foundContext = TERRITORY_NONE;
    int err = decodeMapcodeToLatLonUtf8(&foundLat, &foundLon, mapcode, foundContext, NULL);
    if (err != 0) {
        fprintf(stderr, "error: decoding mapcode to lat/lon failure; "
                "cannot decode '%s')\n", mapcode);
        if (selfCheckEnabled) {
            exit(INTERNAL_ERROR);
        }
        return;
    }
    double deltaLat = ((foundLat - lat) >= 0.0 ? (foundLat - lat) : -(foundLat - lat));
    double deltaLon = ((foundLon - lon) > -0.0 ? (foundLon - lon) : -(foundLon - lon));
    if (deltaLon > 180.0) {
        deltaLon = 360.0 - deltaLon;
    }
    if ((deltaLat > DELTA) || (deltaLon > DELTA)) {
        fprintf(stderr, "error: decoding mapcode to lat/lon failure; "
                        "lat=%.20g, lon=%.20g produces mapcode %s, "
                        "which decodes to lat=%.20g (delta=%.20g), lon=%.20g (delta=%.20g)\n",
                lat, lon, mapcode, foundLat, deltaLat, foundLon, deltaLon);
        if (selfCheckEnabled) {
            exit(INTERNAL_ERROR);
        }
        return;
    }
}